

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIButton.cpp
# Opt level: O1

void __thiscall
irr::gui::CGUIButton::CGUIButton
          (CGUIButton *this,IGUIEnvironment *environment,IGUIElement *parent,s32 id,
          rect<int> rectangle,bool noclip)

{
  long lVar1;
  rect<int> local_28;
  
  local_28.LowerRightCorner = rectangle.LowerRightCorner;
  local_28.UpperLeftCorner = rectangle.UpperLeftCorner;
  *(undefined ***)&this->field_0x290 = &PTR__IReferenceCounted_00261738;
  *(undefined8 *)&this->field_0x298 = 0;
  *(undefined4 *)&this->field_0x2a0 = 1;
  IGUIElement::IGUIElement
            ((IGUIElement *)this,&PTR_construction_vtable_24__0026f2e8,EGUIET_BUTTON,environment,
             parent,id,&local_28);
  *(undefined8 *)this = 0x26f320;
  *(undefined8 *)&this->field_0x290 = 0x26f550;
  *(undefined8 *)this = 0x26f098;
  *(undefined8 *)&this->field_0x290 = 0x26f2c8;
  lVar1 = 0x13d;
  do {
    *(undefined4 *)((long)this + lVar1 + -9) = 0xffffffff;
    *(undefined2 *)((long)this + lVar1 + -1) = 0;
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x191);
  memset(&this->SpriteBank,0,0xe0);
  this->OverrideFont = (IGUIFont *)0x0;
  this->OverrideColorEnabled = false;
  (this->OverrideColor).color = 0x65ffffff;
  this->ClickTime = 0;
  this->HoverTime = 0;
  this->FocusTime = 0;
  this->ClickShiftState = false;
  this->ClickControlState = false;
  this->IsPushButton = false;
  this->Pressed = false;
  this->UseAlphaChannel = false;
  this->DrawBorder = true;
  this->ScaleImage = false;
  this->field_0xa3 = noclip;
  (**(code **)(*(long *)this + 0x18))(this);
  this->field_0x10c = 1;
  IGUIElement::setTabOrder((IGUIElement *)this,-1);
  return;
}

Assistant:

CGUIButton::CGUIButton(IGUIEnvironment *environment, IGUIElement *parent,
		s32 id, core::rect<s32> rectangle, bool noclip) :
		IGUIButton(environment, parent, id, rectangle),
		SpriteBank(0), OverrideFont(0),
		OverrideColorEnabled(false), OverrideColor(video::SColor(101, 255, 255, 255)),
		ClickTime(0), HoverTime(0), FocusTime(0),
		ClickShiftState(false), ClickControlState(false),
		IsPushButton(false), Pressed(false),
		UseAlphaChannel(false), DrawBorder(true), ScaleImage(false)
{
#ifdef _DEBUG
	setDebugName("CGUIButton");
#endif
	setNotClipped(noclip);

	// This element can be tabbed.
	setTabStop(true);
	setTabOrder(-1);
}